

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  uint uVar4;
  ImGuiWindow *window;
  
  pIVar2 = GImGui;
  uVar4 = (GImGui->WindowsFocusOrder).Size - 1;
  if (under_this_window != (ImGuiWindow *)0x0) {
    iVar3 = FindWindowFocusIndex(under_this_window);
    if (iVar3 != -1) {
      uVar4 = iVar3 - 1;
    }
  }
  do {
    if ((int)uVar4 < 0) {
      window = (ImGuiWindow *)0x0;
LAB_001bcfa8:
      FocusWindow(window);
      return;
    }
    pIVar1 = (pIVar2->WindowsFocusOrder).Data[uVar4];
    if (((pIVar1 != ignore_window) && (pIVar1->WasActive == true)) &&
       ((~pIVar1->Flags & 0x40200U) != 0 && (pIVar1->Flags & 0x1000000U) == 0)) {
      window = pIVar1->NavLastChildNavWindow;
      if ((window == (ImGuiWindow *)0x0) || (window->WasActive == false)) {
        window = pIVar1;
      }
      goto LAB_001bcfa8;
    }
    uVar4 = uVar4 - 1;
  } while( true );
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;

    int start_idx = g.WindowsFocusOrder.Size - 1;
    if (under_this_window != NULL)
    {
        int under_this_window_idx = FindWindowFocusIndex(under_this_window);
        if (under_this_window_idx != -1)
            start_idx = under_this_window_idx - 1;
    }
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        if (window != ignore_window && window->WasActive && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}